

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O0

size_t wabt::ReadS64Leb128(uint8_t *p,uint8_t *end,uint64_t *out_value)

{
  bool bVar1;
  uint64_t result_9;
  int top_bits;
  bool sign_bit_set;
  uint64_t result_8;
  uint64_t result_7;
  uint64_t result_6;
  uint64_t result_5;
  uint64_t result_4;
  uint64_t result_3;
  uint64_t result_2;
  uint64_t result_1;
  uint64_t result;
  uint64_t *out_value_local;
  uint8_t *end_local;
  uint8_t *p_local;
  
  if ((p < end) && ((*p & 0x80) == 0)) {
    *out_value = (long)((ulong)*p << 0x39) >> 0x39;
    p_local = (uint8_t *)0x1;
  }
  else if ((p + 1 < end) && ((p[1] & 0x80) == 0)) {
    *out_value = (long)((((ulong)p[1] & 0x7f) << 7 | (ulong)*p & 0x7f) << 0x32) >> 0x32;
    p_local = (uint8_t *)0x2;
  }
  else if ((p + 2 < end) && ((p[2] & 0x80) == 0)) {
    *out_value = (long)((((ulong)p[2] & 0x7f) << 0xe | ((ulong)p[1] & 0x7f) << 7 | (ulong)*p & 0x7f)
                       << 0x2b) >> 0x2b;
    p_local = (uint8_t *)0x3;
  }
  else if ((p + 3 < end) && ((p[3] & 0x80) == 0)) {
    *out_value = (long)((((ulong)p[3] & 0x7f) << 0x15 |
                        ((ulong)p[2] & 0x7f) << 0xe | ((ulong)p[1] & 0x7f) << 7 | (ulong)*p & 0x7f)
                       << 0x24) >> 0x24;
    p_local = (uint8_t *)0x4;
  }
  else if ((p + 4 < end) && ((p[4] & 0x80) == 0)) {
    *out_value = (long)((((ulong)p[4] & 0x7f) << 0x1c |
                        ((ulong)p[3] & 0x7f) << 0x15 |
                        ((ulong)p[2] & 0x7f) << 0xe | ((ulong)p[1] & 0x7f) << 7 | (ulong)*p & 0x7f)
                       << 0x1d) >> 0x1d;
    p_local = (uint8_t *)0x5;
  }
  else if ((p + 5 < end) && ((p[5] & 0x80) == 0)) {
    *out_value = (long)((((ulong)p[5] & 0x7f) << 0x23 |
                        ((ulong)p[4] & 0x7f) << 0x1c |
                        ((ulong)p[3] & 0x7f) << 0x15 |
                        ((ulong)p[2] & 0x7f) << 0xe | ((ulong)p[1] & 0x7f) << 7 | (ulong)*p & 0x7f)
                       << 0x16) >> 0x16;
    p_local = (uint8_t *)0x6;
  }
  else if ((p + 6 < end) && ((p[6] & 0x80) == 0)) {
    *out_value = (long)((((ulong)p[6] & 0x7f) << 0x2a |
                        ((ulong)p[5] & 0x7f) << 0x23 |
                        ((ulong)p[4] & 0x7f) << 0x1c |
                        ((ulong)p[3] & 0x7f) << 0x15 |
                        ((ulong)p[2] & 0x7f) << 0xe | ((ulong)p[1] & 0x7f) << 7 | (ulong)*p & 0x7f)
                       << 0xf) >> 0xf;
    p_local = (uint8_t *)0x7;
  }
  else if ((p + 7 < end) && ((p[7] & 0x80) == 0)) {
    *out_value = (long)((((ulong)p[7] & 0x7f) << 0x31 |
                        ((ulong)p[6] & 0x7f) << 0x2a |
                        ((ulong)p[5] & 0x7f) << 0x23 |
                        ((ulong)p[4] & 0x7f) << 0x1c |
                        ((ulong)p[3] & 0x7f) << 0x15 |
                        ((ulong)p[2] & 0x7f) << 0xe | ((ulong)p[1] & 0x7f) << 7 | (ulong)*p & 0x7f)
                       << 8) >> 8;
    p_local = (uint8_t *)0x8;
  }
  else if ((p + 8 < end) && ((p[8] & 0x80) == 0)) {
    *out_value = (long)((((ulong)p[8] & 0x7f) << 0x38 |
                        ((ulong)p[7] & 0x7f) << 0x31 |
                        ((ulong)p[6] & 0x7f) << 0x2a |
                        ((ulong)p[5] & 0x7f) << 0x23 |
                        ((ulong)p[4] & 0x7f) << 0x1c |
                        ((ulong)p[3] & 0x7f) << 0x15 |
                        ((ulong)p[2] & 0x7f) << 0xe | ((ulong)p[1] & 0x7f) << 7 | (ulong)*p & 0x7f)
                       << 1) >> 1;
    p_local = (uint8_t *)0x9;
  }
  else if ((p + 9 < end) && ((p[9] & 0x80) == 0)) {
    bVar1 = (p[9] & 1) != 0;
    if (((bVar1) && ((p[9] & 0xfe) != 0x7e)) || ((!bVar1 && ((p[9] & 0xfe) != 0)))) {
      p_local = (uint8_t *)0x0;
    }
    else {
      *out_value = (ulong)p[9] << 0x3f |
                   ((ulong)p[8] & 0x7f) << 0x38 |
                   ((ulong)p[7] & 0x7f) << 0x31 |
                   ((ulong)p[6] & 0x7f) << 0x2a |
                   ((ulong)p[5] & 0x7f) << 0x23 |
                   ((ulong)p[4] & 0x7f) << 0x1c |
                   ((ulong)p[3] & 0x7f) << 0x15 |
                   ((ulong)p[2] & 0x7f) << 0xe | ((ulong)p[1] & 0x7f) << 7 | (ulong)*p & 0x7f;
      p_local = (uint8_t *)0xa;
    }
  }
  else {
    p_local = (uint8_t *)0x0;
  }
  return (size_t)p_local;
}

Assistant:

size_t ReadS64Leb128(const uint8_t* p,
                     const uint8_t* end,
                     uint64_t* out_value) {
  if (p < end && (p[0] & 0x80) == 0) {
    uint64_t result = LEB128_1(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 6);
    return 1;
  } else if (p + 1 < end && (p[1] & 0x80) == 0) {
    uint64_t result = LEB128_2(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 13);
    return 2;
  } else if (p + 2 < end && (p[2] & 0x80) == 0) {
    uint64_t result = LEB128_3(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 20);
    return 3;
  } else if (p + 3 < end && (p[3] & 0x80) == 0) {
    uint64_t result = LEB128_4(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 27);
    return 4;
  } else if (p + 4 < end && (p[4] & 0x80) == 0) {
    uint64_t result = LEB128_5(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 34);
    return 5;
  } else if (p + 5 < end && (p[5] & 0x80) == 0) {
    uint64_t result = LEB128_6(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 41);
    return 6;
  } else if (p + 6 < end && (p[6] & 0x80) == 0) {
    uint64_t result = LEB128_7(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 48);
    return 7;
  } else if (p + 7 < end && (p[7] & 0x80) == 0) {
    uint64_t result = LEB128_8(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 55);
    return 8;
  } else if (p + 8 < end && (p[8] & 0x80) == 0) {
    uint64_t result = LEB128_9(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 62);
    return 9;
  } else if (p + 9 < end && (p[9] & 0x80) == 0) {
    // The top bits should be a sign-extension of the sign bit.
    bool sign_bit_set = (p[9] & 0x1);
    int top_bits = p[9] & 0xfe;
    if ((sign_bit_set && top_bits != 0x7e) ||
        (!sign_bit_set && top_bits != 0)) {
      return 0;
    }
    uint64_t result = LEB128_10(uint64_t);
    *out_value = result;
    return 10;
  } else {
    // Past the end.
    return 0;
  }
}